

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

bool __thiscall ON_SectionStyle::Read(ON_SectionStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  SectionBackgroundFillMode mode_00;
  SectionFillRule rule_00;
  undefined1 local_1c0 [8];
  ON_Linetype lt;
  double dStack_108;
  ON_Color c_3;
  double rotation;
  double scale_1;
  int index;
  uchar rule;
  double scale;
  bool local_dd;
  ON_Color c_2;
  byte local_d6;
  bool b;
  ON_Color c_1;
  SectionBackgroundFillMode mode;
  uchar c;
  uchar item_id;
  uint model_component_attributes_filter;
  int iStack_c8;
  bool rc;
  int minor_version;
  int major_version;
  ON_SectionStyle local_b8;
  ON_BinaryArchive *local_20;
  ON_BinaryArchive *file_local;
  ON_SectionStyle *this_local;
  
  local_20 = file;
  file_local = (ON_BinaryArchive *)this;
  ON_SectionStyle(&local_b8);
  operator=(this,&local_b8);
  ~ON_SectionStyle(&local_b8);
  iStack_c8 = 0;
  model_component_attributes_filter = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (local_20,0x40008000,&stack0xffffffffffffff38,
                     (int *)&model_component_attributes_filter);
  if (!bVar1) {
    return false;
  }
  bVar1 = false;
  if (iStack_c8 == 1) {
    c_1.field_0 = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
    bVar2 = ON_BinaryArchive::ReadModelComponentAttributes
                      (local_20,&this->super_ON_ModelComponent,(uint *)&c_1);
    if (bVar2) {
      b = false;
      bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
      if (bVar2) {
        if (b == true) {
          local_d6 = 0;
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&local_d6);
          if (!bVar2) goto LAB_00839669;
          mode_00 = SectionBackgroundFillModeFromUnsigned((uint)local_d6);
          SetBackgroundFillMode(this,mode_00);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          c_2 = ON_Color::UnsetColor;
          bVar2 = ON_BinaryArchive::ReadColor(local_20,&c_2);
          if (!bVar2) goto LAB_00839669;
          SetBackgroundFillColor(this,&c_2,false);
          bVar2 = ON_BinaryArchive::ReadColor(local_20,&c_2);
          if (!bVar2) goto LAB_00839669;
          SetBackgroundFillColor(this,&c_2,true);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          local_dd = true;
          bVar2 = ON_BinaryArchive::ReadBool(local_20,&local_dd);
          if (!bVar2) goto LAB_00839669;
          SetBoundaryVisible(this,(bool)(local_dd & 1));
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          scale._4_4_ = ON_Color::UnsetColor.field_0;
          bVar2 = ON_BinaryArchive::ReadColor(local_20,(ON_Color *)((long)&scale + 4));
          if (!bVar2) goto LAB_00839669;
          SetBoundaryColor(this,(ON_Color *)((long)&scale + 4),false);
          bVar2 = ON_BinaryArchive::ReadColor(local_20,(ON_Color *)((long)&scale + 4));
          if (!bVar2) goto LAB_00839669;
          SetBoundaryColor(this,(ON_Color *)((long)&scale + 4),true);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          _index = 1.0;
          bVar2 = ON_BinaryArchive::ReadDouble(local_20,(double *)&index);
          if (!bVar2) goto LAB_00839669;
          SetBoundaryWidthScale(this,_index);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          scale_1._7_1_ = 0;
          bVar2 = ON_BinaryArchive::ReadChar(local_20,(ON__UINT8 *)((long)&scale_1 + 7));
          if (!bVar2) goto LAB_00839669;
          rule_00 = ON::SectionFillRuleFromUnsigned((uint)scale_1._7_1_);
          SetSectionFillRule(this,rule_00);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          scale_1._0_4_ = 0;
          bVar2 = ON_BinaryArchive::ReadInt(local_20,(ON__INT32 *)&scale_1);
          if (!bVar2) goto LAB_00839669;
          SetHatchIndex(this,scale_1._0_4_);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          rotation = 1.0;
          bVar2 = ON_BinaryArchive::ReadDouble(local_20,&rotation);
          if (!bVar2) goto LAB_00839669;
          SetHatchScale(this,rotation);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          dStack_108 = 0.0;
          bVar2 = ON_BinaryArchive::ReadDouble(local_20,&stack0xfffffffffffffef8);
          if (!bVar2) goto LAB_00839669;
          SetHatchRotation(this,dStack_108);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          lt.m_reserved._3_4_ = ON_Color::UnsetColor.field_0;
          bVar2 = ON_BinaryArchive::ReadColor(local_20,(ON_Color *)(lt.m_reserved + 3));
          if (!bVar2) goto LAB_00839669;
          SetHatchColor(this,(ON_Color *)(lt.m_reserved + 3),false);
          bVar2 = ON_BinaryArchive::ReadColor(local_20,(ON_Color *)(lt.m_reserved + 3));
          if (!bVar2) goto LAB_00839669;
          SetHatchColor(this,(ON_Color *)(lt.m_reserved + 3),true);
          bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
          if (!bVar2) goto LAB_00839669;
        }
        if (b == true) {
          ON_Linetype::ON_Linetype((ON_Linetype *)local_1c0);
          bVar2 = ON_Linetype::Read((ON_Linetype *)local_1c0,local_20);
          if (bVar2) {
            SetBoundaryLinetype(this,(ON_Linetype *)local_1c0);
            bVar2 = ON_BinaryArchive::ReadChar(local_20,&b);
            if (bVar2) {
              bVar2 = false;
            }
            else {
              bVar2 = true;
            }
          }
          else {
            bVar2 = true;
          }
          ON_Linetype::~ON_Linetype((ON_Linetype *)local_1c0);
          if (bVar2) goto LAB_00839669;
        }
        if (0xb < b) {
          b = false;
        }
        bVar1 = true;
      }
    }
  }
LAB_00839669:
  bVar2 = ON_BinaryArchive::EndRead3dmChunk(local_20);
  this_local._7_1_ = bVar1;
  if (!bVar2) {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SectionStyle::Read( ON_BinaryArchive& file)
{
  *this = ON_SectionStyle();

  int major_version=0;
  int minor_version=0;
  if (!file.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version ))
    return false;

  bool rc = false;

  if ( 1 == major_version )
  {
    for (;;)
    {
      // chunk version 1.0 fields
      unsigned int model_component_attributes_filter = 0;
      if (!file.ReadModelComponentAttributes(*this,&model_component_attributes_filter))
        break;

      unsigned char item_id = 0;
      if (!file.ReadChar(&item_id))
        break;

      if (ON_SectionStyleTypeCodes::BackgroundFillMode == item_id) // 1
      {
        unsigned char c = 0;
        if (!file.ReadChar(&c))
          break;

        SectionBackgroundFillMode mode = SectionBackgroundFillModeFromUnsigned(c);
        SetBackgroundFillMode(mode);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BackgroundFillColor == item_id) // 2
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBackgroundFillColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryVisible == item_id) // 3
      {
        bool b = true;
        if (!file.ReadBool(&b))
          break;
        SetBoundaryVisible(b);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryColor == item_id) // 4
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetBoundaryColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryWidthScale == item_id) // 5
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetBoundaryWidthScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::SectionFillRule == item_id) // 6
      {
        unsigned char rule = 0;
        if (!file.ReadChar(&rule))
          break;
        SetSectionFillRule(ON::SectionFillRuleFromUnsigned(rule));
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchIndex == item_id) // 7
      {
        int index = 0;
        if (!file.ReadInt(&index))
          break;
        SetHatchIndex(index);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchScale == item_id) // 8
      {
        double scale = 1.0;
        if (!file.ReadDouble(&scale))
          break;
        SetHatchScale(scale);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchRotation == item_id) // 9
      {
        double rotation = 0;
        if (!file.ReadDouble(&rotation))
          break;
        SetHatchRotation(rotation);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::HatchColor == item_id) // 10
      {
        ON_Color c = ON_Color::UnsetColor;
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, false);
        if (!file.ReadColor(c))
          break;
        SetHatchColor(c, true);
        if (!file.ReadChar(&item_id))
          break;
      }
      if (ON_SectionStyleTypeCodes::BoundaryLinetype == item_id) // 11
      {
        ON_Linetype lt;
        if(!lt.Read(file))
          break;
        SetBoundaryLinetype(lt);
        if (!file.ReadChar(&item_id))
          break;
      }

      if (item_id > ON_SectionStyleTypeCodes::LastSectionStyleTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 0)
        item_id = 0;
      }

      rc = true;
      break;
    }
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}